

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::dragLeaveEvent(QWidgetTextControlPrivate *this)

{
  long lVar1;
  bool bVar2;
  QTextCursor *this_00;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControl *q;
  QRectF crect;
  QTextCursor local_30 [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTextCursor *)q_func(in_RDI);
  QWidgetTextControl::cursorRect
            ((QWidgetTextControl *)0xffffffffffffffff,(QTextCursor *)0xffffffffffffffff);
  QTextCursor::QTextCursor(local_30);
  QTextCursor::operator=(this_00,(QTextCursor *)in_RDI);
  QTextCursor::~QTextCursor(local_30);
  bVar2 = QRectF::isValid((QRectF *)&stack0xffffffffffffffd8);
  if (bVar2) {
    QWidgetTextControl::updateRequest((QWidgetTextControl *)this_00,(QRectF *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::dragLeaveEvent()
{
    Q_Q(QWidgetTextControl);

    const QRectF crect = q->cursorRect(dndFeedbackCursor);
    dndFeedbackCursor = QTextCursor();

    if (crect.isValid())
        emit q->updateRequest(crect);
}